

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O0

void nni_dialer_shutdown(nni_dialer *d)

{
  nni_sock *pnVar1;
  _Bool _Var2;
  nni_pipe *local_20;
  nni_pipe *p;
  nni_sock *s;
  nni_dialer *d_local;
  
  pnVar1 = d->d_sock;
  _Var2 = nni_atomic_flag_test_and_set(&d->d_closing);
  if (!_Var2) {
    nni_dialer_stop(d);
    nni_mtx_lock(&pnVar1->s_mx);
    for (local_20 = (nni_pipe *)nni_list_first(&d->d_pipes); local_20 != (nni_pipe *)0x0;
        local_20 = (nni_pipe *)nni_list_next(&d->d_pipes,local_20)) {
      nni_pipe_close(local_20);
    }
    nni_mtx_unlock(&pnVar1->s_mx);
  }
  return;
}

Assistant:

void
nni_dialer_shutdown(nni_dialer *d)
{
	nni_sock *s = d->d_sock;
	nni_pipe *p;

	if (nni_atomic_flag_test_and_set(&d->d_closing)) {
		return;
	}

	nni_dialer_stop(d);

	nni_mtx_lock(&s->s_mx);
	NNI_LIST_FOREACH (&d->d_pipes, p) {
		nni_pipe_close(p);
	}
	nni_mtx_unlock(&s->s_mx);
}